

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O2

bool __thiscall
jsoncons::typed_array_visitor<std::vector<short,_std::allocator<short>_>_>::visit_double
          (typed_array_visitor<std::vector<short,_std::allocator<short>_>_> *this,double value,
          semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  short local_2;
  
  std::vector<short,_std::allocator<short>_>::emplace_back<short>(this->v_,&local_2);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double value, 
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }